

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_func_begin(string *func_name)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) | 0x80;
  *(undefined8 *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar1 + -0x18)) =
       0x1e;
  poVar2 = std::operator<<(&std::cout,0x23);
  poVar2 = std::operator<<(poVar2," begin ");
  poVar2 = std::operator<<(poVar2,(string *)func_name);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"############################");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void print_func_begin(const std::string& func_name) {
    std::cout.setf(std::ios::right);
    std::cout << std::setw(30) << std::setfill('#') << " begin " << func_name
              << " "
              << "############################" << std::endl;
}